

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O2

bool duckdb::PerformDuplicateElimination
               (Binder *binder,vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns)

{
  pointer pCVar1;
  bool bVar2;
  ClientConfig *pCVar3;
  idx_t iVar4;
  vector<duckdb::CorrelatedColumnInfo,_true> *__range1;
  pointer pCVar5;
  ColumnBinding binding;
  allocator local_b9;
  LogicalType local_b8;
  string local_a0;
  CorrelatedColumnInfo info;
  
  pCVar3 = ClientConfig::GetConfig(binder->context);
  bVar2 = true;
  if (pCVar3->enable_optimizer == true) {
    pCVar5 = (correlated_columns->
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ).
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar1 = (correlated_columns->
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ).
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pCVar5 == pCVar1) {
        return true;
      }
      bVar2 = PerformDelimOnType(&pCVar5->type);
      pCVar5 = pCVar5 + 1;
    } while (bVar2);
    iVar4 = Binder::GenerateTableIndex(binder);
    LogicalType::LogicalType(&local_b8,BIGINT);
    ::std::__cxx11::string::string((string *)&local_a0,"delim_index",&local_b9);
    binding.column_index = 0;
    binding.table_index = iVar4;
    CorrelatedColumnInfo::CorrelatedColumnInfo(&info,binding,&local_b8,&local_a0,0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    LogicalType::~LogicalType(&local_b8);
    ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
    _M_insert_rval(&correlated_columns->
                    super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ,(correlated_columns->
                    super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                    ).
                    super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,&info);
    CorrelatedColumnInfo::~CorrelatedColumnInfo(&info);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool PerformDuplicateElimination(Binder &binder, vector<CorrelatedColumnInfo> &correlated_columns) {
	if (!ClientConfig::GetConfig(binder.context).enable_optimizer) {
		// if optimizations are disabled we always do a delim join
		return true;
	}
	bool perform_delim = true;
	for (auto &col : correlated_columns) {
		if (!PerformDelimOnType(col.type)) {
			perform_delim = false;
			break;
		}
	}
	if (perform_delim) {
		return true;
	}
	auto binding = ColumnBinding(binder.GenerateTableIndex(), 0);
	auto type = LogicalType::BIGINT;
	auto name = "delim_index";
	CorrelatedColumnInfo info(binding, type, name, 0);
	correlated_columns.insert(correlated_columns.begin(), std::move(info));
	return false;
}